

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::IsTrivialMove(Compaction *this)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  Compaction *in_RDI;
  VersionSet *vset;
  undefined8 in_stack_ffffffffffffffd8;
  int which;
  bool local_11;
  VersionSet *files;
  
  which = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  files = in_RDI->input_version_->vset_;
  iVar1 = num_input_files(in_RDI,which);
  local_11 = false;
  if (iVar1 == 1) {
    iVar1 = num_input_files(in_RDI,which);
    local_11 = false;
    if (iVar1 == 0) {
      iVar2 = TotalFileSize((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                             *)files);
      iVar3 = MaxGrandParentOverlapBytes((Options *)0x12d7a2);
      local_11 = iVar2 <= iVar3;
    }
  }
  return local_11;
}

Assistant:

bool Compaction::IsTrivialMove() const {
  const VersionSet* vset = input_version_->vset_;
  // Avoid a move if there is lots of overlapping grandparent data.
  // Otherwise, the move could create a parent file that will require
  // a very expensive merge later on.
  return (num_input_files(0) == 1 && num_input_files(1) == 0 &&
          TotalFileSize(grandparents_) <=
              MaxGrandParentOverlapBytes(vset->options_));
}